

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O2

void funchook_logv(funchook_t *funchook,int set_error,char *fmt,__va_list_tag *ap)

{
  FILE *__s;
  
  if (funchook_debug_file[0] != '\0') {
    if (funchook == (funchook_t *)0x0) {
      __s = fopen(funchook_debug_file,"a");
    }
    else {
      __s = (FILE *)funchook->fp;
      if (__s != (FILE *)0x0) goto LAB_001018e2;
      __s = fopen(funchook_debug_file,"a");
      funchook->fp = (FILE *)__s;
    }
    if (__s != (FILE *)0x0) {
LAB_001018e2:
      if (set_error == 0) {
        vfprintf(__s,fmt,ap);
      }
      else {
        fputs("  ",__s);
        vfprintf(__s,fmt,ap);
        fputc(10,__s);
      }
      if (funchook != (funchook_t *)0x0) {
        fflush(__s);
        return;
      }
      fclose(__s);
      return;
    }
  }
  return;
}

Assistant:

static void funchook_logv(funchook_t *funchook, int set_error, const char *fmt, va_list ap)
{
    FILE *fp;

    if (*funchook_debug_file == '\0') {
        return;
    }
    if (funchook == NULL) {
        fp = fopen(funchook_debug_file, "a");
    } else if (funchook->fp == NULL) {
        funchook->fp = fopen(funchook_debug_file, "a");
        fp = funchook->fp;
    } else {
        fp = funchook->fp;
    }
    if (fp == NULL) {
        return;
    }
    if (set_error) {
        fputs("  ", fp);
    }
    vfprintf(fp, fmt, ap);
    if (set_error) {
        fputc('\n', fp);
    }
    if (funchook == NULL) {
        fclose(fp);
    } else {
        fflush(fp);
    }
}